

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridDataType1::AddValue(GridDataType1 *this,KUINT16 V)

{
  iterator __position;
  unsigned_short local_2;
  
  this->m_ui16NumValues = this->m_ui16NumValues + 1;
  __position._M_current =
       (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    _M_realloc_insert<unsigned_short_const&>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vui16Values,
               __position,&local_2);
  }
  else {
    *__position._M_current = V;
    (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void GridDataType1:: AddValue( KUINT16 V )
{
    ++m_ui16NumValues;
    m_vui16Values.push_back( V );
}